

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UnicodeString *stringToCopy)

{
  UnicodeString *pUVar1;
  UnicodeString *local_50;
  UnicodeString *stringToCopy_local;
  Formattable *this_local;
  
  pUVar1 = stringToCopy;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_004aab28;
  UnicodeString::UnicodeString(&this->fBogus);
  init(this,(EVP_PKEY_CTX *)pUVar1);
  this->fType = kString;
  pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar1);
  local_50 = (UnicodeString *)0x0;
  if (pUVar1 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(pUVar1,stringToCopy);
    local_50 = pUVar1;
  }
  (this->fValue).fObject = (UObject *)local_50;
  return;
}

Assistant:

Formattable::Formattable(const UnicodeString& stringToCopy)
{
    init();
    fType = kString;
    fValue.fString = new UnicodeString(stringToCopy);
}